

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMU.cpp
# Opt level: O1

void __thiscall RTIMU::handleGyroBias(RTIMU *this)

{
  RTVector3 *vec;
  float fVar1;
  float fVar2;
  float fVar3;
  RTFLOAT RVar4;
  RTFLOAT RVar5;
  RTFLOAT RVar6;
  float fVar7;
  uint uVar8;
  int iVar9;
  RTIMUSettings *pRVar10;
  int iVar11;
  float *pfVar12;
  RTFLOAT RVar13;
  RTFLOAT RVar14;
  RTFLOAT RVar15;
  RTFLOAT RVar16;
  RTFLOAT RVar17;
  RTFLOAT RVar18;
  RTVector3 deltaAccel;
  RTVector3 local_30;
  
  uVar8 = this->m_settings->m_axisRotation;
  if (0x16 < uVar8 - 1) goto LAB_00118078;
  pfVar12 = m_axisRotation[uVar8];
  fVar1 = (this->m_imuData).gyro.m_data[0];
  fVar2 = (this->m_imuData).gyro.m_data[1];
  fVar3 = (this->m_imuData).gyro.m_data[2];
  RVar14 = (this->m_imuData).accel.m_data[0];
  RVar4 = (this->m_imuData).accel.m_data[1];
  RVar15 = (this->m_imuData).accel.m_data[2];
  RVar5 = (this->m_imuData).compass.m_data[0];
  RVar6 = (this->m_imuData).compass.m_data[1];
  RVar16 = (this->m_imuData).compass.m_data[2];
  fVar7 = *pfVar12;
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    (this->m_imuData).gyro.m_data[0] = fVar7 * fVar1;
    RVar13 = RVar14;
    RVar18 = RVar5;
LAB_00117f6c:
    (this->m_imuData).accel.m_data[0] = RVar13 * *pfVar12;
    (this->m_imuData).compass.m_data[0] = RVar18 * *pfVar12;
  }
  else {
    fVar7 = m_axisRotation[uVar8][1];
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      pfVar12 = m_axisRotation[uVar8] + 1;
      (this->m_imuData).gyro.m_data[0] = fVar7 * fVar2;
      RVar13 = RVar4;
      RVar18 = RVar6;
      goto LAB_00117f6c;
    }
    fVar7 = m_axisRotation[uVar8][2];
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      pfVar12 = m_axisRotation[uVar8] + 2;
      (this->m_imuData).gyro.m_data[0] = fVar7 * fVar3;
      RVar13 = RVar15;
      RVar18 = RVar16;
      goto LAB_00117f6c;
    }
  }
  fVar7 = m_axisRotation[uVar8][3];
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    pfVar12 = m_axisRotation[uVar8] + 3;
    RVar17 = fVar7 * fVar1;
    RVar13 = RVar14;
    RVar18 = RVar5;
LAB_00117fe7:
    (this->m_imuData).gyro.m_data[1] = RVar17;
    (this->m_imuData).accel.m_data[1] = RVar13 * *pfVar12;
    (this->m_imuData).compass.m_data[1] = RVar18 * *pfVar12;
  }
  else {
    fVar7 = m_axisRotation[uVar8][4];
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      pfVar12 = m_axisRotation[uVar8] + 4;
      RVar17 = fVar7 * fVar2;
      RVar13 = RVar4;
      RVar18 = RVar6;
      goto LAB_00117fe7;
    }
    fVar7 = m_axisRotation[uVar8][5];
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      pfVar12 = m_axisRotation[uVar8] + 5;
      RVar17 = fVar7 * fVar3;
      RVar13 = RVar15;
      RVar18 = RVar16;
      goto LAB_00117fe7;
    }
  }
  fVar7 = m_axisRotation[uVar8][6];
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    pfVar12 = m_axisRotation[uVar8] + 6;
    RVar13 = fVar1 * fVar7;
    RVar15 = RVar14;
    RVar16 = RVar5;
  }
  else {
    fVar1 = m_axisRotation[uVar8][7];
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      pfVar12 = m_axisRotation[uVar8] + 7;
      RVar13 = fVar2 * fVar1;
      RVar15 = RVar4;
      RVar16 = RVar6;
    }
    else {
      fVar1 = m_axisRotation[uVar8][8];
      if ((fVar1 == 0.0) && (!NAN(fVar1))) goto LAB_00118078;
      pfVar12 = m_axisRotation[uVar8] + 8;
      RVar13 = fVar3 * fVar1;
    }
  }
  (this->m_imuData).gyro.m_data[2] = RVar13;
  (this->m_imuData).accel.m_data[2] = RVar15 * *pfVar12;
  (this->m_imuData).compass.m_data[2] = RVar16 * *pfVar12;
LAB_00118078:
  local_30.m_data[2] = (this->m_previousAccel).m_data[2];
  local_30.m_data._0_8_ = *(undefined8 *)(this->m_previousAccel).m_data;
  vec = &(this->m_imuData).accel;
  RTVector3::operator-=(&local_30,vec);
  RTVector3::operator=(&this->m_previousAccel,vec);
  RVar14 = RTVector3::length(&local_30);
  if (RVar14 < 0.05) {
    RVar14 = RTVector3::length(&(this->m_imuData).gyro);
    if (RVar14 < 0.2) {
      iVar9 = this->m_gyroSampleCount;
      iVar11 = this->m_sampleRate * 5;
      pRVar10 = this->m_settings;
      fVar1 = (pRVar10->m_gyroBias).m_data[0];
      fVar2 = (this->m_imuData).gyro.m_data[0];
      if (SBORROW4(iVar9,iVar11) == iVar9 + this->m_sampleRate * -5 < 0) {
        (pRVar10->m_gyroBias).m_data[0] =
             (1.0 - this->m_gyroContinuousAlpha) * fVar1 + fVar2 * this->m_gyroContinuousAlpha;
        (pRVar10->m_gyroBias).m_data[1] =
             this->m_gyroContinuousAlpha * (this->m_imuData).gyro.m_data[1] +
             (pRVar10->m_gyroBias).m_data[1] * (1.0 - this->m_gyroContinuousAlpha);
        (pRVar10->m_gyroBias).m_data[2] =
             this->m_gyroContinuousAlpha * (this->m_imuData).gyro.m_data[2] +
             (pRVar10->m_gyroBias).m_data[2] * (1.0 - this->m_gyroContinuousAlpha);
      }
      else {
        (pRVar10->m_gyroBias).m_data[0] =
             (1.0 - this->m_gyroLearningAlpha) * fVar1 + fVar2 * this->m_gyroLearningAlpha;
        (pRVar10->m_gyroBias).m_data[1] =
             this->m_gyroLearningAlpha * (this->m_imuData).gyro.m_data[1] +
             (pRVar10->m_gyroBias).m_data[1] * (1.0 - this->m_gyroLearningAlpha);
        (pRVar10->m_gyroBias).m_data[2] =
             this->m_gyroLearningAlpha * (this->m_imuData).gyro.m_data[2] +
             (pRVar10->m_gyroBias).m_data[2] * (1.0 - this->m_gyroLearningAlpha);
        this->m_gyroSampleCount = iVar9 + 1;
        if (iVar9 + 1 == iVar11) {
          pRVar10->m_gyroBiasValid = true;
          (*(pRVar10->super_RTIMUHal)._vptr_RTIMUHal[3])();
        }
      }
    }
  }
  RTVector3::operator-=(&(this->m_imuData).gyro,&this->m_settings->m_gyroBias);
  return;
}

Assistant:

void RTIMU::handleGyroBias()
{
    // do axis rotation

    if ((m_settings->m_axisRotation > 0) && (m_settings->m_axisRotation < RTIMU_AXIS_ROTATION_COUNT)) {
        // need to do an axis rotation
        float *matrix = m_axisRotation[m_settings->m_axisRotation];
        RTIMU_DATA tempIMU = m_imuData;

        // do new x value
        if (matrix[0] != 0) {
            m_imuData.gyro.setX(tempIMU.gyro.x() * matrix[0]);
            m_imuData.accel.setX(tempIMU.accel.x() * matrix[0]);
            m_imuData.compass.setX(tempIMU.compass.x() * matrix[0]);
        } else if (matrix[1] != 0) {
            m_imuData.gyro.setX(tempIMU.gyro.y() * matrix[1]);
            m_imuData.accel.setX(tempIMU.accel.y() * matrix[1]);
            m_imuData.compass.setX(tempIMU.compass.y() * matrix[1]);
        } else if (matrix[2] != 0) {
            m_imuData.gyro.setX(tempIMU.gyro.z() * matrix[2]);
            m_imuData.accel.setX(tempIMU.accel.z() * matrix[2]);
            m_imuData.compass.setX(tempIMU.compass.z() * matrix[2]);
        }

        // do new y value
        if (matrix[3] != 0) {
            m_imuData.gyro.setY(tempIMU.gyro.x() * matrix[3]);
            m_imuData.accel.setY(tempIMU.accel.x() * matrix[3]);
            m_imuData.compass.setY(tempIMU.compass.x() * matrix[3]);
        } else if (matrix[4] != 0) {
            m_imuData.gyro.setY(tempIMU.gyro.y() * matrix[4]);
            m_imuData.accel.setY(tempIMU.accel.y() * matrix[4]);
            m_imuData.compass.setY(tempIMU.compass.y() * matrix[4]);
        } else if (matrix[5] != 0) {
            m_imuData.gyro.setY(tempIMU.gyro.z() * matrix[5]);
            m_imuData.accel.setY(tempIMU.accel.z() * matrix[5]);
            m_imuData.compass.setY(tempIMU.compass.z() * matrix[5]);
        }

        // do new z value
        if (matrix[6] != 0) {
            m_imuData.gyro.setZ(tempIMU.gyro.x() * matrix[6]);
            m_imuData.accel.setZ(tempIMU.accel.x() * matrix[6]);
            m_imuData.compass.setZ(tempIMU.compass.x() * matrix[6]);
        } else if (matrix[7] != 0) {
            m_imuData.gyro.setZ(tempIMU.gyro.y() * matrix[7]);
            m_imuData.accel.setZ(tempIMU.accel.y() * matrix[7]);
            m_imuData.compass.setZ(tempIMU.compass.y() * matrix[7]);
        } else if (matrix[8] != 0) {
            m_imuData.gyro.setZ(tempIMU.gyro.z() * matrix[8]);
            m_imuData.accel.setZ(tempIMU.accel.z() * matrix[8]);
            m_imuData.compass.setZ(tempIMU.compass.z() * matrix[8]);
        }
    }

    RTVector3 deltaAccel = m_previousAccel;
    deltaAccel -= m_imuData.accel;   // compute difference
    m_previousAccel = m_imuData.accel;

    if ((deltaAccel.length() < RTIMU_FUZZY_ACCEL_ZERO) && (m_imuData.gyro.length() < RTIMU_FUZZY_GYRO_ZERO)) {
        // what we are seeing on the gyros should be bias only so learn from this

        if (m_gyroSampleCount < (5 * m_sampleRate)) {
            m_settings->m_gyroBias.setX((1.0 - m_gyroLearningAlpha) * m_settings->m_gyroBias.x() + m_gyroLearningAlpha * m_imuData.gyro.x());
            m_settings->m_gyroBias.setY((1.0 - m_gyroLearningAlpha) * m_settings->m_gyroBias.y() + m_gyroLearningAlpha * m_imuData.gyro.y());
            m_settings->m_gyroBias.setZ((1.0 - m_gyroLearningAlpha) * m_settings->m_gyroBias.z() + m_gyroLearningAlpha * m_imuData.gyro.z());

            m_gyroSampleCount++;

            if (m_gyroSampleCount == (5 * m_sampleRate)) {
                // this could have been true already of course
                m_settings->m_gyroBiasValid = true;
                m_settings->saveSettings();
            }
        } else {
            m_settings->m_gyroBias.setX((1.0 - m_gyroContinuousAlpha) * m_settings->m_gyroBias.x() + m_gyroContinuousAlpha * m_imuData.gyro.x());
            m_settings->m_gyroBias.setY((1.0 - m_gyroContinuousAlpha) * m_settings->m_gyroBias.y() + m_gyroContinuousAlpha * m_imuData.gyro.y());
            m_settings->m_gyroBias.setZ((1.0 - m_gyroContinuousAlpha) * m_settings->m_gyroBias.z() + m_gyroContinuousAlpha * m_imuData.gyro.z());
        }
    }

    m_imuData.gyro -= m_settings->m_gyroBias;
}